

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.c
# Opt level: O2

void * worker_func(void *ctx)

{
  mutex_handle *mutex;
  undefined8 *puVar1;
  condvar_handle *condvar;
  uint uVar2;
  
  puVar1 = *(undefined8 **)((long)ctx + 0x10);
  condvar = (condvar_handle *)*puVar1;
  mutex = (mutex_handle *)(condvar + 2);
  mutex_lock(mutex);
  while (uVar2 = *(uint *)&condvar[7].priv, 1 < uVar2) {
    while ((uVar2 == 4 || (uVar2 == 2))) {
      *(uint *)&condvar[7].priv = (uint)(uVar2 != 2) * 2 + 1;
      mutex_unlock(mutex);
      (*(code *)puVar1[1])(puVar1);
      mutex_lock(mutex);
      uVar2 = *(uint *)&condvar[7].priv;
    }
    if (uVar2 < 2) break;
    *(undefined4 *)&condvar[7].priv = 5;
    condvar_wake_all(condvar + 1);
    if (*(uint32_t *)((long)puVar1 + 0x1c) == 0) {
      condvar_wait(condvar,mutex);
    }
    else {
      condvar_wait_time(condvar,mutex,*(uint32_t *)((long)puVar1 + 0x1c));
      if (*(int *)&condvar[7].priv == 5) {
        *(undefined4 *)&condvar[7].priv = 4;
      }
    }
  }
  *(undefined4 *)&condvar[7].priv = 0;
  mutex_unlock(mutex);
  return (void *)0x0;
}

Assistant:

static void *worker_func(void *ctx)
{
	struct thread_handle *th = ctx;
	struct worker_handle *wh = th->func_ctx;
	struct worker_priv *priv = wh->priv;

	mutex_lock(&priv->mutex);

	while (priv->state > WORKER_STOPPING) {
		while (priv->state == WORKER_SIGNALED ||
		       priv->state == WORKER_STOPPING_AFTER_WORK) {
			if (priv->state == WORKER_STOPPING_AFTER_WORK)
				priv->state = WORKER_STOPPING;
			else
				priv->state = WORKER_BUSY;
			mutex_unlock(&priv->mutex);
			wh->func_ptr(wh);
			mutex_lock(&priv->mutex);
		}

		if (priv->state <= WORKER_STOPPING)
			break;

		priv->state = WORKER_IDLE;

		condvar_wake_all(&priv->condvar_idle);

		if (wh->periodic_wake > 0) {
			condvar_wait_time(&priv->condvar, &priv->mutex,
					  wh->periodic_wake);
			if (priv->state == WORKER_IDLE)
				priv->state = WORKER_SIGNALED;
		} else {
			condvar_wait(&priv->condvar, &priv->mutex);
		}
	}

	priv->state = WORKER_STOPPED;

	mutex_unlock(&priv->mutex);

	return NULL;
}